

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.c
# Opt level: O3

filemanager_time * filemanager_getModifiedDate(filemanager_fileinfo *fileinfo)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  filemanager_time *pfVar11;
  tm *ptVar12;
  
  pfVar11 = (filemanager_time *)malloc(0x38);
  ptVar12 = localtime(&(fileinfo->st_mtim).tv_sec);
  iVar2 = ptVar12->tm_min;
  iVar3 = ptVar12->tm_hour;
  iVar4 = ptVar12->tm_mday;
  iVar5 = ptVar12->tm_mon;
  iVar6 = ptVar12->tm_year;
  iVar7 = ptVar12->tm_wday;
  iVar8 = ptVar12->tm_yday;
  iVar9 = ptVar12->tm_isdst;
  uVar10 = *(undefined4 *)&ptVar12->field_0x24;
  lVar1 = ptVar12->tm_gmtoff;
  pfVar11->tm_sec = ptVar12->tm_sec;
  pfVar11->tm_min = iVar2;
  pfVar11->tm_hour = iVar3;
  pfVar11->tm_mday = iVar4;
  pfVar11->tm_mon = iVar5;
  pfVar11->tm_year = iVar6;
  pfVar11->tm_wday = iVar7;
  pfVar11->tm_yday = iVar8;
  pfVar11->tm_isdst = iVar9;
  *(undefined4 *)&pfVar11->field_0x24 = uVar10;
  pfVar11->tm_gmtoff = lVar1;
  pfVar11->tm_zone = ptVar12->tm_zone;
  return pfVar11;
}

Assistant:

filemanager_time *filemanager_getModifiedDate(filemanager_fileinfo *fileinfo) {
	filemanager_time *tmp;
	filemanager_time *time;

	time = (filemanager_time *) malloc(sizeof(filemanager_time));

	tmp = localtime(&fileinfo->st_mtime);
	memcpy(time, tmp, sizeof(filemanager_time));

	return time;
}